

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglChooseConfigReference.cpp
# Opt level: O2

BVec2 __thiscall deqp::egl::ConfigFilter::getSpecifiedLuminanceColors(ConfigFilter *this)

{
  ConfigFilter *pCVar1;
  ConfigFilter *in_RSI;
  long lVar2;
  AttribRule AVar3;
  
  *(undefined2 *)&(this->m_rules)._M_t._M_impl = 0;
  pCVar1 = this;
  for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 4) {
    AVar3 = getAttribute(in_RSI,*(EGLenum *)((long)&DAT_0034000c + lVar2));
    *(bool *)&(pCVar1->m_rules)._M_t._M_impl =
         (uint)((ulong)(AVar3._0_8_ + -0x100000000) >> 0x21) < 0x7fffffff;
    pCVar1 = (ConfigFilter *)&(pCVar1->m_rules)._M_t._M_impl.field_0x1;
  }
  return (BVec2)SUB82(this,0);
}

Assistant:

tcu::BVec2 getSpecifiedLuminanceColors (void) const
	{
		const EGLenum bitAttribs[] =
		{
			EGL_LUMINANCE_SIZE,
			EGL_ALPHA_SIZE
		};

		tcu::BVec2 result;

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(bitAttribs); ndx++)
		{
			const EGLenum	attrib	= bitAttribs[ndx];
			const EGLint	value	= getAttribute(attrib).value;

			if (value != 0 && value != EGL_DONT_CARE)
				result[ndx] = true;
			else
				result[ndx] = false;
		}

		return result;
	}